

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week3-app2.cpp
# Opt level: O0

void __thiscall FancyInteger::print_fancy(FancyInteger *this)

{
  ostream *poVar1;
  FancyInteger *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(this->super_Integer).value);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_fancy() // member-function
    {
        std::cout << "----------------" << std::endl;
        std::cout << value << std::endl;
        std::cout << "----------------" << std::endl;
    }